

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  CustomLayerParams *pCVar4;
  void **ppvVar5;
  long lVar6;
  string err;
  string err_1;
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,-1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar3 = Result::good(&r);
  if (bVar3) {
    validateOutputCount((Result *)&err,layer,1,-1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pCVar4 = Specification::NeuralNetworkLayer::custom(layer);
  if (((pCVar4->classname_).ptr_)->_M_string_length == 0) {
    std::operator+(&err_1,"Custom layer ",(layer->name_).ptr_);
    std::operator+(&err,&err_1,
                   " has an empty \'className\' field. This field is required in order for Core ML to link to the implementation for this custom class."
                  );
    std::__cxx11::string::~string((string *)&err_1);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    pCVar4 = Specification::NeuralNetworkLayer::custom(layer);
    pRVar2 = (pCVar4->weights_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar5 = (void **)0x0;
    }
    iVar1 = (pCVar4->weights_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar6 = 0; (long)iVar1 * 8 != lVar6; lVar6 = lVar6 + 8) {
      bVar3 = checkSingleWeightType(*(WeightParams **)((long)ppvVar5 + lVar6));
      if (!bVar3) {
        std::operator+(&err,"Custom layer ",(layer->name_).ptr_);
        std::operator+(&err_1,&err,
                       " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof."
                      );
        std::__cxx11::string::~string((string *)&err);
        Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&err_1);
      }
    }
    Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, -1);
    }

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return r;
}